

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O3

void processEvent(SWindowData *window_data,XEvent *event)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  mfb_mouse_move_func UNRECOVERED_JUMPTABLE_00;
  mfb_active_func UNRECOVERED_JUMPTABLE;
  mfb_mouse_button_func UNRECOVERED_JUMPTABLE_02;
  mfb_mouse_scroll_func UNRECOVERED_JUMPTABLE_01;
  mfb_key_mod mVar5;
  mfb_mouse_button key;
  bool bVar6;
  float fVar7;
  float fVar8;
  
  iVar1 = event->type;
  switch(iVar1) {
  case 2:
  case 3:
    key = ~MOUSE_BTN_0;
    if ((ulong)(event->xkey).keycode < 0x100) {
      key = (mfb_mouse_button)g_keycodes[(event->xkey).keycode];
    }
    uVar4 = translate_mod_ex(key,(event->xcrossing).mode,(uint)(iVar1 == 2));
    window_data->mod_keys = uVar4;
    window_data->key_status[(int)key] = iVar1 == 2;
    UNRECOVERED_JUMPTABLE_02 = (mfb_mouse_button_func)window_data->keyboard_func;
    if (UNRECOVERED_JUMPTABLE_02 == (mfb_mouse_button_func)0x0) {
      return;
    }
    bVar6 = iVar1 == 2;
    mVar5 = window_data->mod_keys;
    goto LAB_001049cb;
  case 4:
  case 5:
    uVar2 = (event->xkey).state;
    key = (event->xkey).keycode;
    mVar5 = (uVar2 >> 3 & 8 | uVar2 >> 1 & 6 | uVar2 & 1) + (uVar2 & 2) * 8 + (uVar2 & 0x10) * 2;
    window_data->mod_keys = mVar5;
    switch(key) {
    case MOUSE_BTN_1:
    case MOUSE_BTN_2:
    case MOUSE_BTN_3:
      UNRECOVERED_JUMPTABLE_02 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_02 == (mfb_mouse_button_func)0x0) {
        return;
      }
      break;
    case MOUSE_BTN_4:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar8 = 1.0;
      goto LAB_00104a0b;
    case MOUSE_BTN_5:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar8 = -1.0;
LAB_00104a0b:
      fVar7 = 0.0;
LAB_00104a0e:
      (*UNRECOVERED_JUMPTABLE_01)((mfb_window *)window_data,mVar5,fVar7,fVar8);
      return;
    case MOUSE_BTN_6:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar7 = 1.0;
      goto LAB_001049f5;
    case MOUSE_BTN_7:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar7 = -1.0;
LAB_001049f5:
      fVar8 = 0.0;
      goto LAB_00104a0e;
    default:
      UNRECOVERED_JUMPTABLE_02 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_02 == (mfb_mouse_button_func)0x0) {
        return;
      }
      key = key - MOUSE_BTN_4;
    }
    bVar6 = iVar1 == 4;
LAB_001049cb:
    (*UNRECOVERED_JUMPTABLE_02)((mfb_window *)window_data,key,mVar5,bVar6);
    return;
  case 6:
    window_data->mouse_pos_x = (event->xkey).x;
    uVar4 = (event->xkey).y;
    window_data->mouse_pos_y = uVar4;
    UNRECOVERED_JUMPTABLE_00 = window_data->mouse_move_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar3 = (event->xkey).x;
LAB_00104975:
      (*UNRECOVERED_JUMPTABLE_00)((mfb_window *)window_data,uVar3,uVar4);
      return;
    }
    break;
  case 9:
    window_data->is_active = true;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      bVar6 = true;
LAB_0010499a:
      (*UNRECOVERED_JUMPTABLE)((mfb_window *)window_data,bVar6);
      return;
    }
    break;
  case 10:
    window_data->is_active = false;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      bVar6 = false;
      goto LAB_0010499a;
    }
    break;
  case 0x11:
    window_data->close = true;
    break;
  case 0x16:
    window_data->window_width = (event->xexpose).count;
    uVar4 = (event->xgraphicsexpose).major_code;
    window_data->window_height = uVar4;
    resize_dst(window_data,(event->xexpose).count,uVar4);
    resize_GL(window_data);
    UNRECOVERED_JUMPTABLE_00 = window_data->resize_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar3 = window_data->window_width;
      uVar4 = window_data->window_height;
      goto LAB_00104975;
    }
  }
  return;
}

Assistant:

static void 
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease: 
        {
            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);
            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, 1.0f);
                    break;
                case Button5:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, -1.0f);
                    break;

                case 6:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 1.0f, 0.0f);
                    break;
                case 7:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, -1.0f, 0.0f);
                    break;

                default:
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify: 
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;            
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif                
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;
    }
}